

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_wildcard_closure
          (CompositeATN<unsigned_char> *this,CATNClosure *closure,Identifier *id,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Identifier *this_00;
  SimpleException *this_01;
  ATNPath local_c0;
  undefined1 local_9d;
  allocator local_89;
  string local_88;
  CATNNode<unsigned_char> *local_68;
  CATNNode<unsigned_char> *node;
  reference pvStack_58;
  int i;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
  *__range2;
  PriorityChain *priority_local;
  ATNStateStack *stack_local;
  int color_local;
  Identifier *id_local;
  CATNClosure *closure_local;
  CompositeATN<unsigned_char> *this_local;
  
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
           ::begin(&this->m_dict);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
      ::end(&this->m_dict);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                         *)&p);
    if (!bVar1) {
      return;
    }
    pvStack_58 = std::__detail::
                 _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_false,_true>
                 ::operator*(&__end0);
    for (node._4_4_ = 0; iVar3 = node._4_4_,
        iVar2 = CATNMachine<unsigned_char>::get_num_nodes(&pvStack_58->second), iVar3 < iVar2;
        node._4_4_ = node._4_4_ + 1) {
      local_68 = CATNMachine<unsigned_char>::operator[](&pvStack_58->second,node._4_4_);
      this_00 = CATNNode<unsigned_char>::get_submachine(local_68);
      bVar1 = Identifier::operator==(this_00,id);
      if (bVar1) {
        iVar3 = ATNPath::count(stack,&pvStack_58->first,node._4_4_);
        if (1 < iVar3) {
          local_9d = 1;
          this_01 = (SimpleException *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_88,"Upward sentinel reached.",&local_89);
          SimpleException::SimpleException(this_01,&local_88);
          local_9d = 0;
          __cxa_throw(this_01,&SimpleException::typeinfo,SimpleException::~SimpleException);
        }
        ATNPath::push(stack,&pvStack_58->first,node._4_4_);
        ATNPath::ATNPath(&local_c0,&pvStack_58->first,node._4_4_);
        build_closure_exclusive(this,closure,&local_c0,color,stack,priority);
        ATNPath::~ATNPath(&local_c0);
        ATNPath::pop(stack);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_false,_true>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void CompositeATN<TCHAR>::build_wildcard_closure(CATNClosure& closure, const Identifier& id, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    //std::wcout << L"Wildcard " << id << L":" << color << std::endl;

    for (const auto& p : m_dict)
    {
        for (int i = 0; i < p.second.get_num_nodes(); i++)
        {
            const CATNNode<TCHAR>& node = p.second[i];

            if (node.get_submachine() == id)
            {
                if (stack.count(p.first, i) >= 2)
                {
                    //std::cout << "Upward sentinel reached." << std::endl;
                    throw SimpleException("Upward sentinel reached.");
                    //continue;
                }
                stack.push(p.first, i);
                build_closure_exclusive(closure, ATNPath(p.first, i), color, stack, priority);
                stack.pop();
            }
        }
    }
}